

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

void add_segment(mstate m,char *tbase,size_t tsize,flag_t mmapped)

{
  tbinptr addr;
  uint uVar1;
  uint uVar2;
  int iVar3;
  msegmentptr pmVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  malloc_tree_chunk *pmVar8;
  size_t *psVar9;
  byte bVar10;
  bool bVar11;
  tbinptr local_118;
  ulong local_110;
  tchunkptr F_1;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I_1;
  tbinptr *H;
  tchunkptr TP;
  mchunkptr F;
  mchunkptr B;
  bindex_t I;
  mchunkptr tn;
  size_t psize;
  mchunkptr q;
  mchunkptr nextp;
  malloc_tree_chunk **ppmStack_88;
  int nfences;
  mchunkptr p;
  mchunkptr tnext;
  msegmentptr ss;
  mchunkptr sp;
  char *csp;
  char *asp;
  size_t offset;
  char *rawsp;
  size_t ssize;
  char *old_end;
  msegmentptr oldsp;
  char *old_top;
  flag_t mmapped_local;
  size_t tsize_local;
  char *tbase_local;
  mstate m_local;
  
  addr = (tbinptr)m->top;
  pmVar4 = segment_holding(m,(char *)addr);
  pcVar5 = pmVar4->base + pmVar4->size;
  if (((ulong)(pcVar5 + -0x4f) & 0xf) == 0) {
    local_110 = 0;
  }
  else {
    local_110 = 0x10 - ((ulong)(pcVar5 + -0x4f) & 0xf) & 0xf;
  }
  local_118 = (tbinptr)(pcVar5 + (local_110 - 0x5f));
  if (local_118 < addr->child) {
    local_118 = addr;
  }
  init_top(m,(mchunkptr)tbase,tsize - 0x50);
  local_118->head = 0x33;
  local_118->fd = (malloc_tree_chunk *)(m->seg).base;
  local_118->bk = (malloc_tree_chunk *)(m->seg).size;
  local_118->child[0] = (malloc_tree_chunk *)(m->seg).next;
  local_118->child[1] = *(malloc_tree_chunk **)&(m->seg).sflags;
  (m->seg).base = tbase;
  (m->seg).size = tsize;
  (m->seg).sflags = mmapped;
  (m->seg).next = (malloc_segment *)&local_118->fd;
  ppmStack_88 = &local_118->parent;
  do {
    ppmStack_88[1] = (malloc_tree_chunk *)0xb;
    pcVar6 = (char *)(ppmStack_88 + 2);
    ppmStack_88 = ppmStack_88 + 1;
  } while (pcVar6 < pcVar5);
  if (local_118 != addr) {
    uVar7 = (long)local_118 - (long)addr;
    *(ulong *)((long)addr + uVar7 + 8) = *(ulong *)((long)addr + uVar7 + 8) & 0xfffffffffffffffe;
    addr->head = uVar7 | 1;
    *(ulong *)((long)addr + uVar7) = uVar7;
    if (uVar7 >> 3 < 0x20) {
      pmVar8 = (malloc_tree_chunk *)(m->smallbins + (uint)((int)(uVar7 >> 3) << 1));
      bVar10 = (byte)(uVar7 >> 3);
      if ((m->smallmap & 1 << (bVar10 & 0x1f)) == 0) {
        m->smallmap = 1 << (bVar10 & 0x1f) | m->smallmap;
        TP = pmVar8;
      }
      else {
        if (pmVar8->fd < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        TP = pmVar8->fd;
      }
      pmVar8->fd = addr;
      TP->bk = addr;
      addr->fd = TP;
      addr->bk = pmVar8;
    }
    else {
      uVar2 = (uint)(uVar7 >> 8);
      if (uVar2 == 0) {
        K = 0;
      }
      else if (uVar2 < 0x10000) {
        uVar1 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        iVar3 = 0x1f - (uVar1 ^ 0x1f);
        K = iVar3 * 2 + ((uint)(uVar7 >> ((char)iVar3 + 7U & 0x3f)) & 1);
      }
      else {
        K = 0x1f;
      }
      pmVar8 = (malloc_tree_chunk *)(m->treebins + K);
      addr->index = K;
      addr->child[1] = (malloc_tree_chunk *)0x0;
      addr->child[0] = (malloc_tree_chunk *)0x0;
      if ((m->treemap & 1 << ((byte)K & 0x1f)) == 0) {
        m->treemap = 1 << ((byte)K & 0x1f) | m->treemap;
        pmVar8->prev_foot = (size_t)addr;
        addr->parent = pmVar8;
        addr->bk = addr;
        addr->fd = addr;
      }
      else {
        K_1 = pmVar8->prev_foot;
        if (K == 0x1f) {
          bVar10 = 0;
        }
        else {
          bVar10 = 0x3f - ((char)(K >> 1) + '\x06');
        }
        C = (tchunkptr *)(uVar7 << (bVar10 & 0x3f));
        while ((*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != uVar7) {
          psVar9 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
          C = (tchunkptr *)((long)C << 1);
          if (*psVar9 == 0) {
            if (m->least_addr <= psVar9) {
              *psVar9 = (size_t)addr;
              addr->parent = (malloc_tree_chunk *)K_1;
              addr->bk = addr;
              addr->fd = addr;
              return;
            }
            abort();
          }
          K_1 = *psVar9;
        }
        pmVar8 = *(malloc_tree_chunk **)(K_1 + 0x10);
        bVar11 = false;
        if (m->least_addr <= K_1) {
          bVar11 = (malloc_tree_chunk *)m->least_addr <= pmVar8;
        }
        if (!bVar11) {
          abort();
        }
        pmVar8->bk = addr;
        *(tbinptr *)(K_1 + 0x10) = addr;
        addr->fd = pmVar8;
        addr->bk = (malloc_tree_chunk *)K_1;
        addr->parent = (malloc_tree_chunk *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void add_segment(mstate m, char* tbase, size_t tsize, flag_t mmapped) {
  /* Determine locations and sizes of segment, fenceposts, old top */
  char* old_top = (char*)m->top;
  msegmentptr oldsp = segment_holding(m, old_top);
  char* old_end = oldsp->base + oldsp->size;
  size_t ssize = pad_request(sizeof(struct malloc_segment));
  char* rawsp = old_end - (ssize + FOUR_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
  size_t offset = align_offset(chunk2mem(rawsp));
  char* asp = rawsp + offset;
  char* csp = (asp < (old_top + MIN_CHUNK_SIZE))? old_top : asp;
  mchunkptr sp = (mchunkptr)csp;
  msegmentptr ss = (msegmentptr)(chunk2mem(sp));
  mchunkptr tnext = chunk_plus_offset(sp, ssize);
  mchunkptr p = tnext;
  int nfences = 0;

  /* reset top to new space */
  init_top(m, (mchunkptr)tbase, tsize - TOP_FOOT_SIZE);

  /* Set up segment record */
  assert(is_aligned(ss));
  set_size_and_pinuse_of_inuse_chunk(m, sp, ssize);
  *ss = m->seg; /* Push current record */
  m->seg.base = tbase;
  m->seg.size = tsize;
  m->seg.sflags = mmapped;
  m->seg.next = ss;

  /* Insert trailing fenceposts */
  for (;;) {
    mchunkptr nextp = chunk_plus_offset(p, SIZE_T_SIZE);
    p->head = FENCEPOST_HEAD;
    ++nfences;
    if ((char*)(&(nextp->head)) < old_end)
      p = nextp;
    else
      break;
  }
  assert(nfences >= 2);

  /* Insert the rest of old top into a bin as an ordinary free chunk */
  if (csp != old_top) {
    mchunkptr q = (mchunkptr)old_top;
    size_t psize = csp - old_top;
    mchunkptr tn = chunk_plus_offset(q, psize);
    set_free_with_pinuse(q, psize, tn);
    insert_chunk(m, q, psize);
  }

  check_top_chunk(m, m->top);
}